

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::ShaderStorageBufferObjectBase::ValidateWindow4Quads
          (ShaderStorageBufferObjectBase *this,vec3 *lb,vec3 *rb,vec3 *rt,vec3 *lt,int *bad_pixels)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  void *__s;
  long lVar7;
  float *pfVar8;
  int x;
  ulong uVar9;
  ulong uVar10;
  float *pfVar11;
  long lVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  iVar6 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  lVar12 = CONCAT44(extraout_var,iVar6);
  bVar2 = *(byte *)(lVar12 + 8);
  bVar3 = *(byte *)(lVar12 + 0xc);
  bVar4 = *(byte *)(lVar12 + 0x10);
  __s = operator_new(120000);
  uVar13 = 0;
  memset(__s,0,120000);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,100,100,0x1907,
             0x1406,__s);
  fVar15 = 1.0 / (float)(1 << (bVar2 & 0x1f));
  fVar16 = 1.0 / (float)(1 << (bVar3 & 0x1f));
  fVar14 = 1.0 / (float)(1 << (bVar4 & 0x1f));
  lVar12 = (long)__s + 0x2f60;
  bVar5 = true;
  uVar9 = 10;
  do {
    uVar10 = 10;
    lVar7 = 0;
    do {
      fVar1 = *(float *)(lVar12 + -8 + lVar7);
      if (((fVar15 < ABS(fVar1 - lb->m_data[0])) ||
          (fVar16 < ABS(*(float *)(lVar12 + -4 + lVar7) - lb->m_data[1]))) ||
         (fVar14 < ABS(*(float *)(lVar12 + lVar7) - lb->m_data[2]))) {
        anon_unknown_0::Output
                  ("First bad color (%d, %d): %f %f %f\n",(double)fVar1,
                   (double)*(float *)(lVar12 + -4 + lVar7),(double)*(float *)(lVar12 + lVar7),uVar10
                   ,uVar9 & 0xffffffff);
        uVar13 = uVar13 + 1;
        bVar5 = false;
      }
      lVar7 = lVar7 + 0xc;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (lVar7 != 0x168);
    uVar9 = uVar9 + 1;
    lVar12 = lVar12 + 0x4b0;
  } while (uVar9 != 0x28);
  if (!bVar5) {
    anon_unknown_0::Output("Left-bottom quad checking failed. Bad pixels: %d",(ulong)uVar13);
  }
  lVar12 = (long)__s + 0x31b8;
  uVar9 = 10;
  do {
    uVar10 = 0x3c;
    lVar7 = 0;
    do {
      fVar1 = *(float *)(lVar12 + -8 + lVar7);
      if (((fVar15 < ABS(fVar1 - rb->m_data[0])) ||
          (fVar16 < ABS(*(float *)(lVar12 + -4 + lVar7) - rb->m_data[1]))) ||
         (fVar14 < ABS(*(float *)(lVar12 + lVar7) - rb->m_data[2]))) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,
                   (double)*(float *)(lVar12 + -4 + lVar7),(double)*(float *)(lVar12 + lVar7),uVar10
                   ,uVar9 & 0xffffffff);
        uVar13 = uVar13 + 1;
        bVar5 = false;
      }
      lVar7 = lVar7 + 0xc;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (lVar7 != 0x168);
    uVar9 = uVar9 + 1;
    lVar12 = lVar12 + 0x4b0;
  } while (uVar9 != 0x28);
  if (!bVar5) {
    anon_unknown_0::Output("right-bottom quad checking failed. Bad pixels: %d",(ulong)uVar13);
  }
  lVar12 = (long)__s + 0x11c18;
  uVar9 = 0x3c;
  do {
    uVar10 = 0x3c;
    lVar7 = 0;
    do {
      fVar1 = *(float *)(lVar12 + -8 + lVar7);
      if (((fVar15 < ABS(fVar1 - rt->m_data[0])) ||
          (fVar16 < ABS(*(float *)(lVar12 + -4 + lVar7) - rt->m_data[1]))) ||
         (fVar14 < ABS(*(float *)(lVar12 + lVar7) - rt->m_data[2]))) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,
                   (double)*(float *)(lVar12 + -4 + lVar7),(double)*(float *)(lVar12 + lVar7),uVar10
                   ,uVar9 & 0xffffffff);
        uVar13 = uVar13 + 1;
        bVar5 = false;
      }
      lVar7 = lVar7 + 0xc;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (lVar7 != 0x168);
    uVar9 = uVar9 + 1;
    lVar12 = lVar12 + 0x4b0;
  } while (uVar9 != 0x5a);
  if (!bVar5) {
    anon_unknown_0::Output("right-top quad checking failed. Bad pixels: %d",(ulong)uVar13);
  }
  lVar12 = (long)__s + 0x119c0;
  uVar9 = 0x3c;
  do {
    uVar10 = 10;
    lVar7 = 0;
    do {
      fVar1 = *(float *)(lVar12 + -8 + lVar7);
      if (((fVar15 < ABS(fVar1 - lt->m_data[0])) ||
          (fVar16 < ABS(*(float *)(lVar12 + -4 + lVar7) - lt->m_data[1]))) ||
         (fVar14 < ABS(*(float *)(lVar12 + lVar7) - lt->m_data[2]))) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,
                   (double)*(float *)(lVar12 + -4 + lVar7),(double)*(float *)(lVar12 + lVar7),uVar10
                   ,uVar9 & 0xffffffff);
        uVar13 = uVar13 + 1;
        bVar5 = false;
      }
      lVar7 = lVar7 + 0xc;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (lVar7 != 0x168);
    uVar9 = uVar9 + 1;
    lVar12 = lVar12 + 0x4b0;
  } while (uVar9 != 0x5a);
  if (!bVar5) {
    anon_unknown_0::Output("left-top quad checking failed. Bad pixels: %d",(ulong)uVar13);
  }
  pfVar11 = (float *)((long)__s + 0xe108);
  uVar9 = 0x30;
  do {
    uVar10 = 0;
    pfVar8 = pfVar11;
    do {
      if (((fVar15 < ABS(pfVar8[-2])) || (fVar16 < ABS(pfVar8[-1]))) || (fVar14 < ABS(*pfVar8))) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)pfVar8[-2],(double)pfVar8[-1],
                   (double)*pfVar8,uVar10 & 0xffffffff,uVar9 & 0xffffffff);
        uVar13 = uVar13 + 1;
        bVar5 = false;
      }
      uVar10 = uVar10 + 1;
      pfVar8 = pfVar8 + 3;
    } while (uVar10 != 100);
    uVar9 = uVar9 + 1;
    pfVar11 = pfVar11 + 300;
  } while (uVar9 != 0x34);
  if (!bVar5) {
    anon_unknown_0::Output("middle horizontal line checking failed. Bad pixels: %d",(ulong)uVar13);
  }
  lVar12 = (long)__s + 0x248;
  uVar9 = 0;
  do {
    uVar10 = 0x30;
    lVar7 = 0;
    do {
      fVar1 = *(float *)(lVar12 + -8 + lVar7);
      if (((fVar15 < ABS(fVar1)) || (fVar16 < ABS(*(float *)(lVar12 + -4 + lVar7)))) ||
         (fVar14 < ABS(*(float *)(lVar12 + lVar7)))) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,
                   (double)*(float *)(lVar12 + -4 + lVar7),(double)*(float *)(lVar12 + lVar7),uVar10
                   ,uVar9 & 0xffffffff);
        uVar13 = uVar13 + 1;
        bVar5 = false;
      }
      lVar7 = lVar7 + 0xc;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (lVar7 != 0x30);
    uVar9 = uVar9 + 1;
    lVar12 = lVar12 + 0x4b0;
  } while (uVar9 != 100);
  if (!bVar5) {
    anon_unknown_0::Output("middle vertical line checking failed. Bad pixels: %d",(ulong)uVar13);
  }
  if (bad_pixels == (int *)0x0) {
    uVar9 = 0;
  }
  else {
    *bad_pixels = uVar13;
    uVar9 = (ulong)uVar13;
  }
  anon_unknown_0::Output("Bad pixels:%d, counted bad:%d\n",uVar9,(ulong)uVar13);
  operator_delete(__s,120000);
  return bVar5;
}

Assistant:

bool ValidateWindow4Quads(const vec3& lb, const vec3& rb, const vec3& rt, const vec3& lt, int* bad_pixels = NULL)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		const int		  width  = 100;
		const int		  height = 100;
		std::vector<vec3> fb(width * height);
		glReadPixels(0, 0, width, height, GL_RGB, GL_FLOAT, &fb[0]);

		bool status = true;
		int  bad	= 0;

		// left-bottom quad
		for (int y = 10; y < height / 2 - 10; ++y)
		{
			for (int x = 10; x < width / 2 - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], lb, g_color_eps))
				{
					Output("First bad color (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("Left-bottom quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// right-bottom quad
		for (int y = 10; y < height / 2 - 10; ++y)
		{
			for (int x = width / 2 + 10; x < width - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], rb, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("right-bottom quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// right-top quad
		for (int y = height / 2 + 10; y < height - 10; ++y)
		{
			for (int x = width / 2 + 10; x < width - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], rt, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("right-top quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// left-top quad
		for (int y = height / 2 + 10; y < height - 10; ++y)
		{
			for (int x = 10; x < width / 2 - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], lt, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("left-top quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// middle horizontal line should be black
		for (int y = height / 2 - 2; y < height / 2 + 2; ++y)
		{
			for (int x = 0; x < width; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], vec3(0), g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("middle horizontal line checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// middle vertical line should be black
		for (int y = 0; y < height; ++y)
		{
			for (int x = width / 2 - 2; x < width / 2 + 2; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], vec3(0), g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("middle vertical line checking failed. Bad pixels: %d", bad);
			//return status;
		}

		if (bad_pixels)
			*bad_pixels = bad;
		Output("Bad pixels:%d, counted bad:%d\n", bad_pixels == NULL ? 0 : *bad_pixels, bad);
		return status;
	}